

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_pcapng_ext.c
# Opt level: O0

light_pcapng_t * light_pcapng_open_append(char *file_path)

{
  light_pcapng_t *plVar1;
  __fd_t pFVar2;
  char *in_RDI;
  light_pcapng iter;
  void *x_ret_1;
  light_pcapng_t *pcapng;
  void *x_ret;
  light_pcapng local_30;
  undefined8 in_stack_ffffffffffffffe0;
  light_pcapng_t *local_8;
  
  if (in_RDI == (char *)0x0) {
    fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
            ,"light_pcapng_open_append",0x109);
    local_8 = (light_pcapng_t *)0x0;
  }
  else {
    plVar1 = light_pcapng_open_read
                       (in_RDI,(light_boolean)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
    if (plVar1 == (light_pcapng_t *)0x0) {
      fprintf(_stderr,"NULL pointer ERROR at %s::%s::%d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_pcapng_ext.c"
              ,"light_pcapng_open_append",0x10c);
      local_8 = (light_pcapng_t *)0x0;
    }
    else {
      local_8 = plVar1;
      for (local_30 = plVar1->pcapng; local_30 != (light_pcapng)0x0;
          local_30 = light_next_block(local_30)) {
        local_8->pcapng_iter = local_30;
      }
      pFVar2 = light_open((char *)local_8,(__read_mode_t)((ulong)plVar1 >> 0x20));
      local_8->file = pFVar2;
    }
  }
  return local_8;
}

Assistant:

light_pcapng_t *light_pcapng_open_append(const char* file_path)
{
	DCHECK_NULLP(file_path, return NULL);

	light_pcapng_t *pcapng = light_pcapng_open_read(file_path, LIGHT_TRUE);
	DCHECK_NULLP(pcapng, return NULL);

	light_pcapng iter = pcapng->pcapng;
	while (iter != NULL)
	{
		pcapng->pcapng_iter = iter;
		iter = light_next_block(iter);
	}

	pcapng->file = light_open(file_path, LIGHT_OAPPEND);

	return pcapng;
}